

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_reference.h
# Opt level: O0

word_type __thiscall
bv::internal::const_range_reference::operator_cast_to_unsigned_long
          (const_range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
           *this)

{
  long lVar1;
  size_t sVar2;
  word_type wVar3;
  unsigned_long *puVar4;
  size_t in_RDI;
  size_t capped;
  
  puVar4 = (unsigned_long *)(in_RDI + 0x10);
  lVar1 = *(long *)(in_RDI + 8);
  sVar2 = packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
          elements_per_word((packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                             *)0x163290);
  sVar2 = lVar1 + sVar2;
  puVar4 = std::min<unsigned_long>(puVar4,(unsigned_long *)&stack0xffffffffffffffe8);
  wVar3 = packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
          get((packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
               *)*puVar4,sVar2,in_RDI);
  return wVar3;
}

Assistant:

explicit operator word_type() const {
                size_t capped = std::min(_end,
                                         _begin + _v.elements_per_word());
                
                return _v.get(_begin, capped);
            }